

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_lock.h
# Opt level: O0

void __thiscall cornelich::util::spin_lock::unlock(spin_lock *this)

{
  spin_lock *this_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  (this->m_flag).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void unlock() noexcept
    {
        m_flag.clear(std::memory_order_release);
    }